

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expert.hpp
# Opt level: O0

void __thiscall
FastLinearExpert<1,_1>::FastLinearExpert
          (FastLinearExpert<1,_1> *this,FastLinearExpert<1,_1> *param_2)

{
  LinearExpert<1,_1> *in_RSI;
  LinearExpert<1,_1> *in_RDI;
  
  LinearExpert<1,_1>::LinearExpert(in_RSI,in_RDI);
  in_RDI[1].Nu.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = in_RSI[1].Nu.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
        array[0];
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix(&in_RSI->Nu,&in_RDI->Nu);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix(&in_RSI->Nu,&in_RDI->Nu);
  in_RDI[1].invSigma.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
  array[0] = in_RSI[1].invSigma.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
             m_storage.m_data.array[0];
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
class FastLinearExpert : public LINEAR_EXPERT_base
{
public:
    // Inherited from base class LinearExpert<d,D>
    typedef IMLE_TYPENAME LINEAR_EXPERT_base::Z Z;
    typedef IMLE_TYPENAME LINEAR_EXPERT_base::X X;
    typedef IMLE_TYPENAME LINEAR_EXPERT_base::ZZ ZZ;
    typedef IMLE_TYPENAME LINEAR_EXPERT_base::XZ XZ;
    typedef IMLE_TYPENAME LINEAR_EXPERT_base::XX XX;

#ifdef IMLE_NO_TEMPLATES
    using LINEAR_EXPERT_base::d;
    using LINEAR_EXPERT_base::D;

	FastLinearExpert(int d, int D, Z const &z, X const &x, IMLE *_mixture);
    FastLinearExpert(int d, int D);
    FastLinearExpert & operator=(FastLinearExpert const &other);  // This is due to a STL annoyance (see http://blog.copton.net/archives/2007/10/13/stdvector/index.html)
#else
	FastLinearExpert(Z const &z, X const &x, IMLE<d,D,::FastLinearExpert> *_mixture);
    FastLinearExpert();
    FastLinearExpert<d,D> & operator=(FastLinearExpert<d,D> const &other);  // This is due to a STL annoyance (see http://blog.copton.net/archives/2007/10/13/stdvector/index.html)
#endif

    void e_step( Z const &z, X const &x, Scal h );
    void m_step();

    void queryNewPredXVar( Z const &z, Scal hNorm );

    using LINEAR_EXPERT_base::Nu;
    using LINEAR_EXPERT_base::Mu;
    using LINEAR_EXPERT_base::Lambda;
    using LINEAR_EXPERT_base::invSigma;
    using LINEAR_EXPERT_base::Psi;
    using LINEAR_EXPERT_base::invPsi;

    void modelDisplay(std::ostream &out = std::cout) const;

protected:
    // Boost serialization
    friend class boost::serialization::access;
    template<typename Archive>
    inline void serialize(Archive & ar, const unsigned int version);

    // Shared prior
#ifdef IMLE_NO_TEMPLATES
	IMLE *mixture;
#else
    IMLE<d,D,::FastLinearExpert> *mixture;
#endif

    // Memory Traces
    using LINEAR_EXPERT_base::H;
    using LINEAR_EXPERT_base::Sh;
    using LINEAR_EXPERT_base::Sz;
    using LINEAR_EXPERT_base::Sx;
    using LINEAR_EXPERT_base::Sxz;
    using LINEAR_EXPERT_base::Sxx;
    ZZ invSzz;
    ZZ invSzz0;
    Scal detInvSzz0;

    // Priors parameters and decay
    using LINEAR_EXPERT_base::Nu0;
    using LINEAR_EXPERT_base::alpha;
    using LINEAR_EXPERT_base::wPsi;
    using LINEAR_EXPERT_base::wNu;
    using LINEAR_EXPERT_base::wSigma;
    using LINEAR_EXPERT_base::wLambda;

    // Recomputing
    using LINEAR_EXPERT_base::recompute;

	// Aux variables
    using LINEAR_EXPERT_base::sqrtDetInvSigma;
    using LINEAR_EXPERT_base::sqrtDetInvPsi;
    using LINEAR_EXPERT_base::varLambda;

    // Active learning
    using LINEAR_EXPERT_base::gamma;
    using LINEAR_EXPERT_base::dGamma;
    using LINEAR_EXPERT_base::newGamma;
    using LINEAR_EXPERT_base::dNewGamma;
}